

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret_manager.cpp
# Opt level: O1

SecretType * __thiscall
duckdb::SecretManager::LookupTypeInternal
          (SecretType *__return_storage_ptr__,SecretManager *this,string *type)

{
  bool bVar1;
  string local_40;
  
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  (__return_storage_ptr__->name)._M_string_length = 0;
  (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->default_provider)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->default_provider).field_2;
  (__return_storage_ptr__->default_provider)._M_string_length = 0;
  (__return_storage_ptr__->default_provider).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->extension)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->extension).field_2;
  (__return_storage_ptr__->extension)._M_string_length = 0;
  (__return_storage_ptr__->extension).field_2._M_local_buf[0] = '\0';
  bVar1 = TryLookupTypeInternal(this,type,__return_storage_ptr__);
  if (bVar1) {
    return __return_storage_ptr__;
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,anon_var_dwarf_4f001a4 + 9);
  ThrowTypeNotFoundError(this,type,&local_40);
}

Assistant:

SecretType SecretManager::LookupTypeInternal(const string &type) {
	SecretType return_value;
	if (!TryLookupTypeInternal(type, return_value)) {
		ThrowTypeNotFoundError(type);
	}
	return return_value;
}